

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O3

void arena_postfork_parent(tsdn_t *tsdn,arena_t *arena)

{
  long lVar1;
  ulong uVar2;
  uint i;
  long lVar3;
  
  lVar3 = 0;
  do {
    if (bin_infos[lVar3].n_shards != 0) {
      lVar1 = 0;
      uVar2 = 0;
      do {
        bin_postfork_parent(tsdn,(bin_t *)((long)&((arena->bins[lVar3].bin_shards)->lock).field_0 +
                                          lVar1));
        uVar2 = uVar2 + 1;
        lVar1 = lVar1 + 0x118;
      } while (uVar2 < bin_infos[lVar3].n_shards);
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x24);
  malloc_mutex_postfork_parent(tsdn,&arena->large_mtx);
  base_postfork_parent(tsdn,arena->base);
  malloc_mutex_postfork_parent(tsdn,&arena->extent_avail_mtx);
  extents_postfork_parent(tsdn,&arena->extents_dirty);
  extents_postfork_parent(tsdn,&arena->extents_muzzy);
  extents_postfork_parent(tsdn,&arena->extents_retained);
  malloc_mutex_postfork_parent(tsdn,&arena->extent_grow_mtx);
  malloc_mutex_postfork_parent(tsdn,&(arena->decay_dirty).mtx);
  malloc_mutex_postfork_parent(tsdn,&(arena->decay_muzzy).mtx);
  malloc_mutex_postfork_parent(tsdn,&arena->tcache_ql_mtx);
  return;
}

Assistant:

void
arena_postfork_parent(tsdn_t *tsdn, arena_t *arena) {
	unsigned i;

	for (i = 0; i < SC_NBINS; i++) {
		for (unsigned j = 0; j < bin_infos[i].n_shards; j++) {
			bin_postfork_parent(tsdn,
			    &arena->bins[i].bin_shards[j]);
		}
	}
	malloc_mutex_postfork_parent(tsdn, &arena->large_mtx);
	base_postfork_parent(tsdn, arena->base);
	malloc_mutex_postfork_parent(tsdn, &arena->extent_avail_mtx);
	extents_postfork_parent(tsdn, &arena->extents_dirty);
	extents_postfork_parent(tsdn, &arena->extents_muzzy);
	extents_postfork_parent(tsdn, &arena->extents_retained);
	malloc_mutex_postfork_parent(tsdn, &arena->extent_grow_mtx);
	malloc_mutex_postfork_parent(tsdn, &arena->decay_dirty.mtx);
	malloc_mutex_postfork_parent(tsdn, &arena->decay_muzzy.mtx);
	if (config_stats) {
		malloc_mutex_postfork_parent(tsdn, &arena->tcache_ql_mtx);
	}
}